

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

int __thiscall Parse::returnStmt(Parse *this)

{
  KeyWordTable *pKVar1;
  DelimiterTable *pDVar2;
  int iVar3;
  mapped_type *pmVar4;
  long lVar5;
  ostream *poVar6;
  pointer pTVar7;
  int iVar8;
  char *pcVar9;
  allocator local_41;
  key_type local_40;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type != KEYWORD) {
    return 0;
  }
  pKVar1 = this->keyWordTable;
  std::__cxx11::string::string((string *)&local_40,"return",&local_41);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&(pKVar1->
                         super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ).index,&local_40);
  iVar8 = *pmVar4;
  iVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].id;
  std::__cxx11::string::~string((string *)&local_40);
  if (iVar8 != iVar3) {
    return 0;
  }
  this->curIndex = this->curIndex + 1;
  iVar3 = expression(this);
  iVar8 = *(int *)(*(long *)&(this->st->symbolTable).
                             super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[this->curFun].
                             super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                             ._M_impl.super__Vector_impl_data + 0x20);
  if (iVar3 == 0) {
    if (iVar8 != 7) {
      pcVar9 = anon_var_dwarf_28086;
      goto LAB_0010a792;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],char_const(&)[3],char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               (char (*) [3])"__",(char (*) [3])"__",(char (*) [3])"__");
  }
  else {
    if (iVar8 == 7) {
      pcVar9 = anon_var_dwarf_28092;
LAB_0010a792:
      poVar6 = std::operator<<((ostream *)&std::cout,pcVar9);
      iVar8 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
              super__Vector_impl_data._M_start[this->curIndex].line;
      goto LAB_0010a7ad;
    }
    std::vector<QuadTuple,std::allocator<QuadTuple>>::
    emplace_back<char_const(&)[7],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
              ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,(char (*) [7])"return",
               &this->expName,(char (*) [3])"__",(char (*) [3])"__");
  }
  lVar5 = (long)this->curIndex;
  pTVar7 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar7[lVar5].type == DELIMTER) {
    pDVar2 = this->delimiterTable;
    std::__cxx11::string::string((string *)&local_40,anon_var_dwarf_27e36 + 0x12,&local_41);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar2->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_40);
    iVar8 = *pmVar4;
    iVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    std::__cxx11::string::~string((string *)&local_40);
    if (iVar8 == iVar3) {
      this->curIndex = this->curIndex + 1;
      return 1;
    }
    lVar5 = (long)this->curIndex;
    pTVar7 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  std::operator<<((ostream *)&std::cout,(string *)&pTVar7[lVar5].name);
  poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_280ac);
  iVar8 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].line + -1;
LAB_0010a7ad:
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
  poVar6 = std::operator<<(poVar6,anon_var_dwarf_27d3a);
  std::endl<char,std::char_traits<char>>(poVar6);
  exit(0);
}

Assistant:

int Parse::returnStmt() {
    if(tokenVec[curIndex].type == KEYWORD && keyWordTable.index["return"] == tokenVec[curIndex].id) {
        curIndex++;
        if(!expression()) {
            Type returnType = st.symbolTable[curFun][0].type;
            //cout << returnType << endl;
            if(returnType != Type::VOID) {
                cout << "函数类型需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            quadVec.emplace_back("return", "__", "__", "__");
        } else {
            Type returnType = st.symbolTable[curFun][0].type;
//            cout << returnType << endl;
            if(returnType == Type::VOID) {
                cout << "函数类型是void 不需要返回值在第" << tokenVec[curIndex].line << "行" << endl;
                exit(0);
            }
            //return语句四元式设计
            quadVec.emplace_back("return", expName, "__", "__");
        }
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index[";"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            cout << tokenVec[curIndex].name;
            cout<<"return 语句缺少';'在第" << tokenVec[curIndex].line -1 << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}